

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callSetup,void *mem)

{
  uint uVar1;
  uint nvec;
  long *plVar2;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  void *pvVar3;
  undefined4 *__s;
  N_Vector p_Var4;
  N_Vector y;
  long lVar5;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  double *pdVar6;
  realtype *dotprods;
  N_Vector z_01;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  double *pdVar24;
  long lVar25;
  double dVar26;
  realtype rVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  int iVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  
  auVar35._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar35._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar35._8_4_ = -(uint)(ycor == (N_Vector)0x0);
  auVar35._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar11 = movmskps((int)w,auVar35);
  iVar8 = -0x385;
  if (((iVar11 == 0 && mem != (void *)0x0) && (plVar2 = (long *)NLS->content, *plVar2 != 0)) &&
     (plVar2[1] != 0)) {
    z = (N_Vector)plVar2[0xd];
    x = (N_Vector)plVar2[0xe];
    z_00 = (N_Vector)plVar2[0x11];
    *(undefined4 *)(plVar2 + 0x12) = 0;
    plVar2[0x13] = 0;
    plVar2[0x14] = 0;
    iVar8 = 0x386;
    if (*(int *)((long)NLS->content + 0x90) < *(int *)((long)NLS->content + 0x94)) {
      do {
        N_VScale(1.0,ycor,z);
        iVar8 = (**NLS->content)(ycor,x,mem);
        if (iVar8 != 0) break;
        pvVar3 = NLS->content;
        uVar1 = *(uint *)((long)pvVar3 + 0x10);
        uVar23 = (ulong)uVar1;
        if (uVar23 == 0) {
          N_VScale(1.0,x,ycor);
        }
        else {
          nvec = *(uint *)((long)pvVar3 + 0x90);
          __s = *(undefined4 **)((long)pvVar3 + 0x18);
          p_Var4 = *(N_Vector *)((long)pvVar3 + 0x80);
          y = *(N_Vector *)((long)pvVar3 + 0x78);
          lVar5 = *(long *)((long)pvVar3 + 0x48);
          lVar14 = *(long *)((long)pvVar3 + 0x50);
          Y = *(N_Vector **)((long)pvVar3 + 0x58);
          c = *(realtype **)((long)pvVar3 + 0x40);
          X = *(N_Vector **)((long)pvVar3 + 0x60);
          pdVar6 = *(double **)((long)pvVar3 + 0x30);
          dotprods = *(realtype **)((long)pvVar3 + 0x38);
          z_01 = *(N_Vector *)((long)pvVar3 + 0x88);
          iVar8 = *(int *)((long)pvVar3 + 0x20);
          dVar28 = *(double *)((long)pvVar3 + 0x28);
          if (0 < (int)uVar1) {
            memset(__s,0,uVar23 * 4);
          }
          uVar9 = nvec - 1;
          uVar17 = (long)(int)uVar9 % (long)(int)uVar1 & 0xffffffff;
          N_VLinearSum(1.0,x,-1.0,z,z_01);
          uVar21 = (uint)((long)(int)uVar9 % (long)(int)uVar1);
          if (0 < (int)nvec) {
            N_VLinearSum(1.0,x,-1.0,p_Var4,*(N_Vector *)(lVar14 + (long)(int)uVar21 * 8));
            N_VLinearSum(1.0,z_01,-1.0,y,*(N_Vector *)(lVar5 + (long)(int)uVar21 * 8));
          }
          N_VScale(1.0,x,p_Var4);
          N_VScale(1.0,z_01,y);
          if (nvec == 1) {
            p_Var4 = *(N_Vector *)(lVar5 + uVar17 * 8);
            rVar27 = N_VDotProd(p_Var4,p_Var4);
            dVar26 = 0.0;
            if (0.0 < rVar27) {
              p_Var4 = *(N_Vector *)(lVar5 + uVar17 * 8);
              rVar27 = N_VDotProd(p_Var4,p_Var4);
              if (rVar27 < 0.0) {
                dVar26 = sqrt(rVar27);
              }
              else {
                dVar26 = SQRT(rVar27);
              }
            }
            *pdVar6 = dVar26;
            N_VScale(1.0 / dVar26,*(N_Vector *)(lVar5 + uVar17 * 8),Y[uVar17]);
            *__s = 0;
          }
          else {
            if (nvec == 0) {
              N_VScale(1.0,x,ycor);
              goto LAB_00507a34;
            }
            if ((int)nvec <= (int)uVar1) {
              N_VScale(1.0,*(N_Vector *)(lVar5 + (long)(int)uVar21 * 8),ycor);
              if (1 < (int)nvec) {
                uVar23 = 0;
                do {
                  __s[uVar23] = (int)uVar23;
                  rVar27 = N_VDotProd(Y[uVar23],ycor);
                  pdVar6[(long)(int)(uVar9 * uVar1) + uVar23] = rVar27;
                  N_VLinearSum(1.0,ycor,-rVar27,Y[uVar23],ycor);
                  uVar23 = uVar23 + 1;
                } while (uVar9 != uVar23);
              }
              rVar27 = N_VDotProd(ycor,ycor);
              dVar26 = 0.0;
              if (0.0 < rVar27) {
                rVar27 = N_VDotProd(ycor,ycor);
                if (rVar27 < 0.0) {
                  dVar26 = sqrt(rVar27);
                }
                else {
                  dVar26 = SQRT(rVar27);
                }
              }
              pdVar6[(long)(int)(uVar1 * uVar9 + nvec) + -1] = dVar26;
              N_VScale((realtype)(~-(ulong)(dVar26 == 0.0) & (ulong)(1.0 / dVar26)),ycor,
                       Y[(int)uVar21]);
              __s[(int)uVar9] = uVar9;
              goto LAB_00507834;
            }
            uVar9 = uVar1 - 1;
            if ((int)uVar1 < 2) {
LAB_0050755c:
              N_VScale(1.0,*(N_Vector *)(lVar5 + (long)(int)uVar21 * 8),ycor);
            }
            else {
              uVar18 = (ulong)uVar9;
              pauVar15 = (undefined1 (*) [16])(pdVar6 + uVar23 * 2);
              uVar22 = 2;
              uVar17 = 0;
              do {
                uVar16 = uVar17 + 1;
                uVar12 = (ulong)(uVar1 * (int)uVar16);
                auVar35 = *(undefined1 (*) [16])(pdVar6 + uVar17 + uVar12);
                dVar30 = auVar35._0_8_ * auVar35._0_8_ + auVar35._8_8_ * auVar35._8_8_;
                dVar26 = 0.0;
                if (0.0 < dVar30) {
                  if (dVar30 < 0.0) {
                    dVar26 = sqrt(dVar30);
                  }
                  else {
                    dVar26 = SQRT(dVar30);
                  }
                }
                auVar31._8_8_ = dVar26;
                auVar31._0_8_ = dVar26;
                auVar35 = divpd(auVar35,auVar31);
                pdVar6[uVar17 + uVar12] = dVar26;
                pdVar6[uVar17 + uVar12 + 1] = 0.0;
                dVar26 = auVar35._0_8_;
                dVar30 = auVar35._8_8_;
                if ((int)uVar17 + 2 < (int)uVar1) {
                  pauVar10 = pauVar15;
                  uVar12 = uVar23;
                  do {
                    auVar38._8_8_ =
                         *(double *)*pauVar10 * -dVar30 + *(double *)((long)*pauVar10 + 8) * dVar26;
                    auVar38._0_8_ =
                         *(double *)*pauVar10 * dVar26 + *(double *)((long)*pauVar10 + 8) * dVar30;
                    *pauVar10 = auVar38;
                    uVar12 = uVar12 - 1;
                    pauVar10 = (undefined1 (*) [16])((long)*pauVar10 + uVar23 * 8);
                  } while (uVar22 != uVar12);
                }
                N_VLinearSum(dVar26,Y[uVar17],dVar30,Y[uVar16],ycor);
                N_VLinearSum(-dVar30,Y[uVar17],dVar26,Y[uVar16],Y[uVar16]);
                N_VScale(1.0,ycor,Y[uVar17]);
                uVar22 = uVar22 + 1;
                pauVar15 = (undefined1 (*) [16])((long)*pauVar15 + (uVar23 + 1) * 8);
                uVar17 = uVar16;
              } while (uVar16 != uVar18);
              if ((int)uVar1 < 2) goto LAB_0050755c;
              uVar22 = 1;
              pdVar19 = pdVar6;
              uVar17 = uVar18;
              pdVar24 = pdVar6;
              do {
                do {
                  *pdVar19 = pdVar19[uVar23];
                  uVar17 = uVar17 - 1;
                  pdVar19 = pdVar19 + 1;
                } while (uVar17 != 0);
                uVar22 = uVar22 + 1;
                pdVar19 = pdVar24 + uVar23;
                uVar17 = uVar18;
                pdVar24 = pdVar19;
              } while (uVar22 != uVar23);
              N_VScale(1.0,*(N_Vector *)(lVar5 + (long)(int)uVar21 * 8),ycor);
              if (1 < (int)uVar1) {
                uVar23 = 0;
                do {
                  rVar27 = N_VDotProd(Y[uVar23],ycor);
                  pdVar6[(long)(int)(uVar9 * uVar1) + uVar23] = rVar27;
                  N_VLinearSum(1.0,ycor,-rVar27,Y[uVar23],ycor);
                  uVar23 = uVar23 + 1;
                } while (uVar18 != uVar23);
              }
            }
            rVar27 = N_VDotProd(ycor,ycor);
            dVar26 = 0.0;
            if (0.0 < rVar27) {
              rVar27 = N_VDotProd(ycor,ycor);
              if (rVar27 < 0.0) {
                dVar26 = sqrt(rVar27);
              }
              else {
                dVar26 = SQRT(rVar27);
              }
            }
            pdVar6[(long)(int)(uVar1 * uVar1) + -1] = dVar26;
            N_VScale(1.0 / dVar26,ycor,Y[(int)uVar9]);
            auVar38 = _DAT_00781f50;
            auVar31 = _DAT_0077bb40;
            auVar35 = _DAT_0077bb30;
            uVar9 = uVar21 + 1;
            if ((int)uVar9 < (int)uVar1) {
              uVar23 = 0;
              do {
                __s[uVar23] = uVar9 + (int)uVar23;
                uVar23 = uVar23 + 1;
              } while (~uVar21 + uVar1 != uVar23);
              uVar23 = uVar23 & 0xffffffff;
            }
            else {
              uVar23 = 0;
            }
            if (-1 < (int)uVar21) {
              lVar13 = (ulong)uVar9 - 1;
              auVar29._8_4_ = (int)lVar13;
              auVar29._0_8_ = lVar13;
              auVar29._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar17 = 0;
              do {
                iVar11 = (int)uVar17;
                auVar32._8_4_ = iVar11;
                auVar32._0_8_ = uVar17;
                auVar32._12_4_ = (int)(uVar17 >> 0x20);
                auVar36 = (auVar32 | auVar35) ^ auVar31;
                iVar33 = SUB164(auVar29 ^ auVar31,0);
                bVar7 = iVar33 < auVar36._0_4_;
                iVar34 = SUB164(auVar29 ^ auVar31,4);
                iVar37 = auVar36._4_4_;
                if ((bool)(~(iVar34 < iVar37 || iVar37 == iVar34 && bVar7) & 1)) {
                  __s[uVar23 + uVar17] = iVar11;
                }
                if (iVar34 >= iVar37 && (iVar37 != iVar34 || !bVar7)) {
                  __s[uVar23 + uVar17 + 1] = iVar11 + 1;
                }
                auVar32 = (auVar32 | auVar38) ^ auVar31;
                iVar37 = auVar32._4_4_;
                if (iVar37 <= iVar34 && (iVar37 != iVar34 || auVar32._0_4_ <= iVar33)) {
                  __s[uVar23 + uVar17 + 2] = iVar11 + 2;
                  __s[uVar23 + uVar17 + 3] = iVar11 + 3;
                }
                uVar17 = uVar17 + 4;
              } while ((uVar21 + 4 & 0xfffffffc) != uVar17);
            }
          }
LAB_00507834:
          if ((int)uVar1 < (int)nvec) {
            nvec = uVar1;
          }
          uVar23 = (ulong)nvec;
          iVar11 = N_VDotProdMulti(nvec,z_01,Y,dotprods);
          if (iVar11 == 0) {
            *c = 1.0;
            *X = x;
            uVar17 = (ulong)DAT_0077bb00;
            if ((int)nvec < 1) {
              uVar18 = 1;
            }
            else {
              lVar13 = (long)(int)uVar1;
              pdVar19 = (double *)((long)pdVar6 + (lVar13 * 8 + 8) * uVar23 + -8);
              uVar18 = 1;
              lVar20 = 0;
              uVar22 = uVar23;
              do {
                uVar16 = uVar22 - 1;
                if ((long)uVar22 < (long)uVar23) {
                  rVar27 = dotprods[uVar16];
                  pdVar24 = pdVar19;
                  lVar25 = lVar20;
                  do {
                    rVar27 = rVar27 - *pdVar24 * dotprods[uVar23 + lVar25];
                    dotprods[uVar16] = rVar27;
                    lVar25 = lVar25 + 1;
                    pdVar24 = pdVar24 + lVar13;
                  } while ((int)lVar25 != 0);
                }
                dVar26 = dotprods[uVar16];
                dVar30 = 0.0;
                if ((dVar26 != 0.0) || (NAN(dVar26))) {
                  dVar30 = dVar26 / pdVar6[(int)((uVar1 + 1) * (int)uVar16)];
                }
                dotprods[uVar16] = dVar30;
                c[uVar18] = (realtype)((ulong)dVar30 ^ uVar17);
                X[uVar18] = *(N_Vector *)(lVar14 + (long)(int)__s[uVar16] * 8);
                uVar18 = uVar18 + 1;
                lVar20 = lVar20 + -1;
                pdVar19 = (double *)((long)pdVar19 + (lVar13 * 8 ^ 0xfffffffffffffff8U));
                uVar22 = uVar16;
              } while (uVar18 != nvec + 1);
            }
            iVar11 = (int)uVar18;
            if (iVar8 != 0) {
              dVar28 = 1.0 - dVar28;
              uVar18 = uVar18 & 0xffffffff;
              c[uVar18] = (realtype)((ulong)dVar28 ^ uVar17);
              X[uVar18] = z_01;
              if ((int)nvec < 1) {
                iVar11 = iVar11 + 1;
              }
              else {
                lVar13 = uVar18 + 1;
                lVar14 = (ulong)(nvec - 1) + 1;
                do {
                  c[lVar13] = dotprods[lVar14 + -1] * dVar28;
                  X[lVar13] = *(N_Vector *)(lVar5 + (long)(int)__s[lVar14 + -1] * 8);
                  lVar13 = lVar13 + 1;
                  lVar20 = lVar14 + -1;
                  bVar7 = 0 < lVar14;
                  lVar14 = lVar20;
                } while (lVar20 != 0 && bVar7);
                iVar11 = (int)lVar13;
              }
            }
            N_VLinearCombination(iVar11,c,X,ycor);
          }
        }
LAB_00507a34:
        plVar2 = (long *)((long)NLS->content + 0x98);
        *plVar2 = *plVar2 + 1;
        N_VLinearSum(1.0,ycor,-1.0,z,z_00);
        iVar8 = (**(code **)((long)NLS->content + 8))
                          (tol,NLS,ycor,z_00,w,*(undefined8 *)((long)NLS->content + 0xa8));
        if (iVar8 != 0x385) {
          if (iVar8 == 0) {
            return 0;
          }
          goto LAB_00507acc;
        }
        pvVar3 = NLS->content;
        iVar8 = *(int *)((long)pvVar3 + 0x90) + 1;
        *(int *)((long)pvVar3 + 0x90) = iVar8;
      } while (iVar8 < *(int *)((long)pvVar3 + 0x94));
      iVar8 = 0x386;
    }
LAB_00507acc:
    plVar2 = (long *)((long)NLS->content + 0xa0);
    *plVar2 = *plVar2 + 1;
  }
  return iVar8;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector ycor, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print current iteration number and the nonlinear residual */
  if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
      && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
  {
    fprintf(FP_CONTENT(NLS)->info_file,
            "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
            (long int) FP_CONTENT(NLS)->niters);
  }
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
    "iter = %ld, nni = %ld", (long int) 0, FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
        && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(FP_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
              (long int) FP_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
      "iter = %ld, nni = %ld, wrmsnorm = %.16g",  (long int) FP_CONTENT(NLS)->curiter,
      FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}